

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram.cpp
# Opt level: O1

void __thiscall
duckdb::
HistogramFinalizeFunction<duckdb::HistogramGenericFunctor,duckdb::string_t,duckdb::StringMapType<duckdb::OwningStringMap<unsigned_long,std::unordered_map<duckdb::string_t,unsigned_long,duckdb::StringHash,duckdb::StringEquality,std::allocator<std::pair<duckdb::string_t_const,unsigned_long>>>>>>
          (duckdb *this,Vector *state_vector,AggregateInputData *param_2,Vector *result,idx_t count,
          idx_t offset)

{
  ulong uVar1;
  ulong *puVar2;
  ArenaAllocator *pAVar3;
  data_ptr_t pdVar4;
  ArenaAllocator *this_00;
  byte bVar5;
  FunctionData *pFVar6;
  ArenaAllocator *pAVar7;
  Vector *result_00;
  Vector *pVVar8;
  Vector *pVVar9;
  ulong uVar10;
  TemplatedValidityData<unsigned_long> *pTVar11;
  ulong uVar12;
  Allocator **ppAVar13;
  long lVar14;
  OrderModifiers modifiers;
  undefined8 *puVar15;
  string_t sort_key;
  UnifiedVectorFormat sdata;
  FunctionData *local_a8;
  ArenaAllocator *pAStack_a0;
  AggregateInputData *local_98;
  data_ptr_t local_90;
  idx_t local_88;
  unsigned_long local_80;
  UnifiedVectorFormat local_78;
  
  modifiers = SUB82(offset,0);
  local_88 = count;
  UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
  Vector::ToUnifiedFormat((Vector *)this,(idx_t)result,&local_78);
  FlatVector::VerifyFlatVector((Vector *)param_2);
  result_00 = (Vector *)ListVector::GetListSize((Vector *)param_2);
  if (result == (Vector *)0x0) {
    lVar14 = 0;
  }
  else {
    lVar14 = 0;
    uVar12 = 0;
    do {
      uVar10 = uVar12;
      if ((local_78.sel)->sel_vector != (sel_t *)0x0) {
        uVar10 = (ulong)(local_78.sel)->sel_vector[uVar12];
      }
      if (**(long **)(local_78.data + uVar10 * 8) != 0) {
        lVar14 = lVar14 + *(long *)(**(long **)(local_78.data + uVar10 * 8) + 0x20);
      }
      uVar12 = uVar12 + 1;
    } while (result != (Vector *)uVar12);
  }
  ListVector::Reserve((Vector *)param_2,(long)&result_00->vector_type + lVar14);
  pVVar8 = MapVector::GetKeys((Vector *)param_2);
  pVVar9 = MapVector::GetValues((Vector *)param_2);
  if (result != (Vector *)0x0) {
    pAVar3 = param_2[1].allocator;
    pdVar4 = pVVar9->data;
    local_98 = param_2 + 2;
    uVar12 = 0;
    local_90 = local_78.data;
    do {
      uVar10 = uVar12;
      if ((local_78.sel)->sel_vector != (sel_t *)0x0) {
        uVar10 = (ulong)(local_78.sel)->sel_vector[uVar12];
      }
      uVar1 = uVar12 + local_88;
      lVar14 = **(long **)(local_90 + uVar10 * 8);
      if (lVar14 == 0) {
        if (*(long *)&param_2[1].combine_type == 0) {
          local_80 = *(unsigned_long *)&param_2[2].combine_type;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)&local_a8,&local_80);
          pAVar7 = pAStack_a0;
          pFVar6 = local_a8;
          local_a8 = (FunctionData *)0x0;
          pAStack_a0 = (ArenaAllocator *)0x0;
          this_00 = param_2[2].allocator;
          param_2[2].bind_data.ptr = pFVar6;
          param_2[2].allocator = pAVar7;
          if (this_00 != (ArenaAllocator *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00);
          }
          if (pAStack_a0 != (ArenaAllocator *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pAStack_a0);
          }
          pTVar11 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                               local_98);
          *(unsigned_long **)&param_2[1].combine_type =
               (unsigned_long *)
               (pTVar11->owned_data).
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>;
        }
        bVar5 = (byte)uVar1 & 0x3f;
        puVar2 = (ulong *)(*(long *)&param_2[1].combine_type + (uVar1 >> 6) * 8);
        *puVar2 = *puVar2 & (-2L << bVar5 | 0xfffffffffffffffeU >> 0x40 - bVar5);
      }
      else {
        (&pAVar3->allocator)[uVar1 * 2] = (Allocator *)result_00;
        for (puVar15 = *(undefined8 **)(lVar14 + 0x18); puVar15 != (undefined8 *)0x0;
            puVar15 = (undefined8 *)*puVar15) {
          sort_key.value.pointer.ptr = (char *)pVVar8;
          sort_key.value._0_8_ = puVar15[2];
          CreateSortKeyHelpers::DecodeSortKey
                    ((CreateSortKeyHelpers *)puVar15[1],sort_key,result_00,0x302,modifiers);
          *(undefined8 *)(pdVar4 + (long)result_00 * 8) = puVar15[3];
          result_00 = (Vector *)&result_00->field_0x1;
        }
        ppAVar13 = &pAVar3->allocator + uVar1 * 2;
        ppAVar13[1] = (Allocator *)((long)result_00 - (long)*ppAVar13);
      }
      uVar12 = uVar12 + 1;
    } while ((Vector *)uVar12 != result);
  }
  ListVector::SetListSize((Vector *)param_2,(idx_t)result_00);
  Vector::Verify((Vector *)param_2,(idx_t)result);
  if (local_78.owned_sel.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.owned_sel.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return;
}

Assistant:

static void HistogramFinalizeFunction(Vector &state_vector, AggregateInputData &, Vector &result, idx_t count,
                                      idx_t offset) {
	using HIST_STATE = HistogramAggState<T, typename MAP_TYPE::MAP_TYPE>;

	UnifiedVectorFormat sdata;
	state_vector.ToUnifiedFormat(count, sdata);
	auto states = UnifiedVectorFormat::GetData<HIST_STATE *>(sdata);

	auto &mask = FlatVector::Validity(result);
	auto old_len = ListVector::GetListSize(result);
	idx_t new_entries = 0;
	// figure out how much space we need
	for (idx_t i = 0; i < count; i++) {
		auto &state = *states[sdata.sel->get_index(i)];
		if (!state.hist) {
			continue;
		}
		new_entries += state.hist->size();
	}
	// reserve space in the list vector
	ListVector::Reserve(result, old_len + new_entries);
	auto &keys = MapVector::GetKeys(result);
	auto &values = MapVector::GetValues(result);
	auto list_entries = FlatVector::GetData<list_entry_t>(result);
	auto count_entries = FlatVector::GetData<uint64_t>(values);

	idx_t current_offset = old_len;
	for (idx_t i = 0; i < count; i++) {
		const auto rid = i + offset;
		auto &state = *states[sdata.sel->get_index(i)];
		if (!state.hist) {
			mask.SetInvalid(rid);
			continue;
		}

		auto &list_entry = list_entries[rid];
		list_entry.offset = current_offset;
		for (auto &entry : *state.hist) {
			OP::template HistogramFinalize<T>(entry.first, keys, current_offset);
			count_entries[current_offset] = entry.second;
			current_offset++;
		}
		list_entry.length = current_offset - list_entry.offset;
	}
	D_ASSERT(current_offset == old_len + new_entries);
	ListVector::SetListSize(result, current_offset);
	result.Verify(count);
}